

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::skip_space
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,char_type_conflict **ptr)

{
  int iVar1;
  int *piVar2;
  iterator __position;
  size_t sVar3;
  int *piVar4;
  int *piVar5;
  size_t sVar6;
  size_t sVar7;
  parse_state local_19;
  
  piVar2 = this->end_input_;
  piVar5 = *ptr;
  if (piVar5 < piVar2) {
    sVar6 = this->line_;
    sVar7 = this->position_;
    piVar4 = piVar5;
    do {
      iVar1 = *piVar4;
      piVar5 = piVar4;
      if (iVar1 < 0xd) {
        if (iVar1 == 9) {
LAB_003f78e4:
          piVar5 = piVar4 + 1;
          sVar7 = sVar7 + 1;
          this->position_ = sVar7;
        }
        else {
          if (iVar1 != 10) break;
          piVar5 = piVar4 + 1;
          sVar6 = sVar6 + 1;
          this->line_ = sVar6;
          sVar7 = sVar7 + 1;
          this->position_ = sVar7;
          this->mark_position_ = sVar7;
        }
      }
      else {
        if (iVar1 != 0xd) {
          if (iVar1 == 0x20) goto LAB_003f78e4;
          break;
        }
        piVar5 = piVar4 + 1;
        this->position_ = sVar7 + 1;
        if (piVar2 <= piVar5) {
          local_19 = this->state_;
          __position._M_current =
               (this->state_stack_).
               super__Vector_base<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->state_stack_).
              super__Vector_base<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<jsoncons::parse_state,std::allocator<jsoncons::parse_state>>::
            _M_realloc_insert<jsoncons::parse_state_const&>
                      ((vector<jsoncons::parse_state,std::allocator<jsoncons::parse_state>> *)
                       &this->state_stack_,__position,&local_19);
          }
          else {
            *__position._M_current = local_19;
            (this->state_stack_).
            super__Vector_base<jsoncons::parse_state,_std::allocator<jsoncons::parse_state>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          this->state_ = cr;
          break;
        }
        sVar6 = sVar6 + 1;
        this->line_ = sVar6;
        sVar3 = sVar7 + 1;
        if (*piVar5 == 10) {
          piVar5 = piVar4 + 2;
          this->position_ = sVar7 + 2;
          sVar3 = sVar7 + 2;
        }
        sVar7 = sVar3;
        this->mark_position_ = sVar7;
      }
      piVar4 = piVar5;
    } while (piVar5 < piVar2);
  }
  *ptr = piVar5;
  return;
}

Assistant:

void skip_space(char_type const ** ptr)
    {
        const char_type* local_input_end = end_input_;
        const char_type* cur = *ptr;

        while (cur < local_input_end) 
        {
            if (*cur == ' ' || *cur == '\t')
            {
                ++cur;
                ++position_;
                continue;
            }
            if (*cur == '\n')
            {
                ++cur;
                ++line_;
                ++position_;
                mark_position_ = position_;
                continue;
            }
            if (*cur == '\r')
            {
                ++cur;
                ++position_;
                if (cur < local_input_end)
                {
                    ++line_;
                    if (*cur == '\n')
                    {
                        ++cur;
                        ++position_;
                    }
                    mark_position_ = position_;
                }
                else
                {
                    push_state(state_);
                    state_ = parse_state::cr;
                    *ptr = cur;
                    return; 
                }
                continue;
            }
            break;
        }
        *ptr = cur;
    }